

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

void __thiscall
wasm::
WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>_>
::runOnFunction(WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>_>
                *this,Module *module,Function *func)

{
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    (this->
    super_PostWalker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
    ).
    super_Walker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
    .currModule = module;
    (this->
    super_PostWalker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
    ).
    super_Walker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
    .currFunction = func;
    Walker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
    ::walk(&(this->
            super_PostWalker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
            ).
            super_Walker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
           ,&func->body);
    anon_unknown_150::TrivialOnceFunctionCollector::visitFunction
              ((TrivialOnceFunctionCollector *)this,func);
    (this->
    super_PostWalker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
    ).
    super_Walker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
    .currFunction = (Function *)0x0;
    (this->
    super_PostWalker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
    ).
    super_Walker<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_wasm::Visitor<wasm::(anonymous_namespace)::TrivialOnceFunctionCollector,_void>_>
    .currModule = (Module *)0x0;
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x223,
                "virtual void wasm::WalkerPass<wasm::PostWalker<wasm::(anonymous namespace)::TrivialOnceFunctionCollector>>::runOnFunction(Module *, Function *) [WalkerType = wasm::PostWalker<wasm::(anonymous namespace)::TrivialOnceFunctionCollector>]"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    assert(getPassRunner());
    WalkerType::walkFunctionInModule(func, module);
  }